

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_client2.c
# Opt level: O0

void my_debug(void *ctx,int level,char *file,int line,char *str)

{
  char *local_40;
  char *basename;
  char *p;
  char *str_local;
  int line_local;
  char *file_local;
  int level_local;
  void *ctx_local;
  
  local_40 = file;
  for (basename = file; *basename != '\0'; basename = basename + 1) {
    if ((*basename == '/') || (*basename == '\\')) {
      local_40 = basename + 1;
    }
  }
  fprintf((FILE *)ctx,"%s:%04d: |%d| %s",local_40,(ulong)(uint)line,(ulong)(uint)level,str);
  fflush((FILE *)ctx);
  return;
}

Assistant:

static void my_debug( void *ctx, int level,
                      const char *file, int line,
                      const char *str )
{
    const char *p, *basename;

    /* Extract basename from file */
    for( p = basename = file; *p != '\0'; p++ )
        if( *p == '/' || *p == '\\' )
            basename = p + 1;

    mbedtls_fprintf( (FILE *) ctx, "%s:%04d: |%d| %s", basename, line, level, str );
    fflush(  (FILE *) ctx  );
}